

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O0

void show_shifts(void)

{
  int iVar1;
  uint local_1c;
  int k;
  int j;
  int i;
  shifts *p;
  
  local_1c = 0;
  for (_j = first_shift; _j != (shifts *)0x0; _j = _j->next) {
    if (local_1c != 0) {
      printf("\n");
    }
    printf("shift %d, number = %d, nshifts = %d\n",(ulong)local_1c,(ulong)(uint)_j->number,
           (ulong)(uint)_j->nshifts);
    iVar1 = _j->nshifts;
    for (k = 0; k < iVar1; k = k + 1) {
      printf("\t%d\n",(ulong)(uint)_j->shift[k]);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void show_shifts()
{
    shifts *p;
    int i, j, k;

    k = 0;
    for (p = first_shift; p; ++k, p = p->next)
    {
	if (k) printf("\n");
	printf("shift %d, number = %d, nshifts = %d\n", k, p->number,
		p->nshifts);
	j = p->nshifts;
	for (i = 0; i < j; ++i)
	    printf("\t%d\n", p->shift[i]);
    }
}